

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall perfetto::ConsoleInterceptor::OnSetup(ConsoleInterceptor *this,SetupArgs *args)

{
  int iVar1;
  int __fd;
  bool bVar2;
  Decoder config;
  ConsoleConfig_Decoder CStack_698;
  
  __fd = (anonymous_namespace)::g_output_fd_for_testing +
         (uint)((anonymous_namespace)::g_output_fd_for_testing == 0);
  iVar1 = isatty(__fd);
  protos::pbzero::ConsoleConfig_Decoder::ConsoleConfig_Decoder
            (&CStack_698,
             &((args->config->interceptor_config_).ptr_._M_t.
               super___uniq_ptr_impl<perfetto::protos::gen::InterceptorConfig,_std::default_delete<perfetto::protos::gen::InterceptorConfig>_>
               ._M_t.
               super__Tuple_impl<0UL,_perfetto::protos::gen::InterceptorConfig_*,_std::default_delete<perfetto::protos::gen::InterceptorConfig>_>
               .super__Head_base<0UL,_perfetto::protos::gen::InterceptorConfig_*,_false>.
              _M_head_impl)->console_config_);
  bVar2 = iVar1 != 0;
  if (CStack_698.super_TypedProtoDecoder<2,_false>.super_TypedProtoDecoderBase.fields_[2].id_ != 0)
  {
    bVar2 = CStack_698.super_TypedProtoDecoder<2,_false>.super_TypedProtoDecoderBase.fields_[2].
            int_value_ != 0;
  }
  iVar1 = (int)CStack_698.super_TypedProtoDecoder<2,_false>.super_TypedProtoDecoderBase.fields_[1].
               int_value_;
  if (iVar1 == 2) {
    __fd = iVar1;
  }
  if (iVar1 == 1) {
    __fd = iVar1;
  }
  this->fd_ = __fd;
  this->use_colors_ = bVar2;
  std::unique_ptr<protozero::Field[],_std::default_delete<protozero::Field[]>_>::~unique_ptr
            (&CStack_698.super_TypedProtoDecoder<2,_false>.super_TypedProtoDecoderBase.heap_storage_
            );
  return;
}

Assistant:

void ConsoleInterceptor::OnSetup(const SetupArgs& args) {
  int fd = STDOUT_FILENO;
  if (g_output_fd_for_testing)
    fd = g_output_fd_for_testing;
#if !PERFETTO_BUILDFLAG(PERFETTO_OS_WIN) && \
    !PERFETTO_BUILDFLAG(PERFETTO_OS_WASM)
  bool use_colors = isatty(fd);
#else
  bool use_colors = false;
#endif
  protos::pbzero::ConsoleConfig::Decoder config(
      args.config.interceptor_config().console_config_raw());
  if (config.has_enable_colors())
    use_colors = config.enable_colors();
  if (config.output() == protos::pbzero::ConsoleConfig::OUTPUT_STDOUT) {
    fd = STDOUT_FILENO;
  } else if (config.output() == protos::pbzero::ConsoleConfig::OUTPUT_STDERR) {
    fd = STDERR_FILENO;
  }
  fd_ = fd;
  use_colors_ = use_colors;
}